

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O3

rhash rhash_init(uint hash_id)

{
  pinit_t p_Var1;
  int *piVar2;
  long lVar3;
  rhash prVar4;
  size_t *psVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  uint uVar10;
  uint *puVar11;
  uint uVar12;
  ulong uVar13;
  uint *puVar14;
  
  uVar7 = hash_id & 0x3ff;
  if (uVar7 == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    uVar8 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
      }
    }
    uVar12 = 1;
    uVar10 = 1 << ((byte)uVar8 & 0x1f);
    if (uVar7 == uVar10) {
      sVar9 = rhash_info_table[uVar8].context_size;
    }
    else {
      if (uVar7 < uVar10) {
LAB_004d983a:
        __assert_fail("num > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                      ,0x7a,"rhash rhash_init(unsigned int)");
      }
      lVar3 = (ulong)uVar8 - 0xb;
      psVar5 = &rhash_info_table[uVar8].context_size;
      sVar9 = 0;
      uVar12 = 0;
      uVar6 = uVar10;
      do {
        lVar3 = lVar3 + 1;
        if (lVar3 == 0) {
          __assert_fail("bit_index < RHASH_HASH_COUNT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                        ,0x71,"rhash rhash_init(unsigned int)");
        }
        if ((uVar6 & uVar7) != 0) {
          sVar9 = sVar9 + (*psVar5 + 7 & 0xfffffffffffffff8);
          uVar12 = uVar12 + 1;
        }
        psVar5 = psVar5 + 7;
        uVar6 = uVar6 * 2;
      } while (uVar6 <= uVar7);
      if (uVar12 < 2) goto LAB_004d983a;
    }
    uVar13 = (ulong)uVar12;
    prVar4 = (rhash)malloc(sVar9 + uVar13 * 0x10 + 0x38);
    if (prVar4 != (rhash)0x0) {
      prVar4->msg_size = 0;
      *(undefined8 *)&prVar4->hash_id = 0;
      prVar4[1].msg_size = 0;
      *(undefined8 *)&prVar4[1].hash_id = 0;
      prVar4[3].msg_size = 0;
      *(undefined8 *)&prVar4[3].hash_id = 0;
      prVar4[2].msg_size = 0;
      *(undefined8 *)&prVar4[2].hash_id = 0;
      prVar4[4].msg_size = 0;
      prVar4->hash_id = uVar7;
      *(undefined8 *)((long)&prVar4[1].msg_size + 4) = 0xb01dbabe00000001;
      *(uint *)&prVar4[1].msg_size = uVar12;
      if (&prVar4[uVar13 + 3].hash_id < &prVar4[uVar13 + 3].hash_id) {
        __assert_fail("phash_ctx >= (char*)&rctx->vector[num]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                      ,0x8e,"rhash rhash_init(unsigned int)");
      }
      if (uVar7 < uVar10) {
        return prVar4;
      }
      uVar12 = 0;
      puVar11 = &prVar4[uVar13 + 3].hash_id;
      do {
        puVar14 = puVar11;
        if ((uVar10 & uVar7) != 0) {
          sVar9 = rhash_info_table[uVar8].context_size;
          if (sVar9 == 0) {
            __assert_fail("info->context_size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                          ,0x97,"rhash rhash_init(unsigned int)");
          }
          if (((ulong)puVar11 & 7) != 0) {
            __assert_fail("((phash_ctx - (char*)0) & 7) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                          ,0x98,"rhash rhash_init(unsigned int)");
          }
          p_Var1 = rhash_info_table[uVar8].init;
          if (p_Var1 == (pinit_t)0x0) {
            __assert_fail("info->init != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                          ,0x99,"rhash rhash_init(unsigned int)");
          }
          *(rhash_hash_info **)&prVar4[(ulong)uVar12 + 3].hash_id = rhash_info_table + uVar8;
          prVar4[(ulong)uVar12 + 4].msg_size = (unsigned_long_long)puVar11;
          puVar14 = (uint *)((sVar9 + 7 & 0xfffffffffffffff8) + (long)puVar11);
          (*p_Var1)(puVar11);
          uVar12 = uVar12 + 1;
        }
        uVar8 = uVar8 + 1;
        uVar10 = uVar10 * 2;
        puVar11 = puVar14;
        if (uVar7 < uVar10) {
          return prVar4;
        }
      } while( true );
    }
  }
  return (rhash)0x0;
}

Assistant:

RHASH_API rhash rhash_init(unsigned hash_id)
{
	unsigned tail_bit_index; /* index of hash_id trailing bit */
	unsigned num = 0;        /* number of hashes to compute */
	rhash_context_ext *rctx = NULL; /* allocated rhash context */
	size_t hash_size_sum = 0;   /* size of hash contexts to store in rctx */

	unsigned i, bit_index, id;
	struct rhash_hash_info* info;
	size_t aligned_size;
	char* phash_ctx;

	hash_id &= RHASH_ALL_HASHES;
	if (hash_id == 0) {
		errno = EINVAL;
		return NULL;
	}

	tail_bit_index = rhash_ctz(hash_id); /* get trailing bit index */
	assert(tail_bit_index < RHASH_HASH_COUNT);

	id = 1 << tail_bit_index;

	if (hash_id == id) {
		/* handle the most common case of only one hash */
		num = 1;
		info = &rhash_info_table[tail_bit_index];
		hash_size_sum = info->context_size;
	} else {
		/* another case: hash_id contains several hashes */
		for (bit_index = tail_bit_index; id <= hash_id; bit_index++, id = id << 1) {
			assert(id != 0);
			assert(bit_index < RHASH_HASH_COUNT);
			info = &rhash_info_table[bit_index];
			if (hash_id & id) {
				/* align sizes by 8 bytes */
				aligned_size = (info->context_size + 7) & ~7;
				hash_size_sum += aligned_size;
				num++;
			}
		}
		assert(num > 1);
	}

	/* align the size of the rhash context common part */
	aligned_size = (offsetof(rhash_context_ext, vector[num]) + 7) & ~7;
	assert(aligned_size >= sizeof(rhash_context_ext));

	/* allocate rhash context with enough memory to store contexts of all used hashes */
	rctx = (rhash_context_ext*)malloc(aligned_size + hash_size_sum);
	if (rctx == NULL) return NULL;

	/* initialize common fields of the rhash context */
	memset(rctx, 0, sizeof(rhash_context_ext));
	rctx->rc.hash_id = hash_id;
	rctx->flags = RCTX_AUTO_FINAL; /* turn on auto-final by default */
	rctx->state = STATE_ACTIVE;
	rctx->hash_vector_size = num;

	/* aligned hash contexts follows rctx->vector[num] in the same memory block */
	phash_ctx = (char*)rctx + aligned_size;
	assert(phash_ctx >= (char*)&rctx->vector[num]);

	/* initialize context for every hash in a loop */
	for (bit_index = tail_bit_index, id = 1 << tail_bit_index, i = 0;
		id <= hash_id; bit_index++, id = id << 1)
	{
		/* check if a hash function with given id shall be included into rctx */
		if ((hash_id & id) != 0) {
			info = &rhash_info_table[bit_index];
			assert(info->context_size > 0);
			assert(((phash_ctx - (char*)0) & 7) == 0); /* hash context is aligned */
			assert(info->init != NULL);

			rctx->vector[i].hash_info = info;
			rctx->vector[i].context = phash_ctx;

#if 0
			/* BTIH initialization is complex, save pointer for later */
			if ((id & RHASH_BTIH) != 0) rctx->bt_ctx = phash_ctx;
#endif
			phash_ctx += (info->context_size + 7) & ~7;

			/* initialize the i-th hash context */
			info->init(rctx->vector[i].context);
			i++;
		}
	}

	return &rctx->rc; /* return allocated and initialized rhash context */
}